

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_settings(nghttp2_bufs *bufs,nghttp2_settings *frame)

{
  nghttp2_buf_chain *pnVar1;
  size_t sVar2;
  nghttp2_buf *buf;
  nghttp2_settings *frame_local;
  nghttp2_bufs *bufs_local;
  
  if (bufs->head == bufs->cur) {
    pnVar1 = bufs->head;
    if ((ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last) < (frame->hd).length) {
      bufs_local._4_4_ = -0x20a;
    }
    else {
      (pnVar1->buf).pos = (pnVar1->buf).pos + -9;
      nghttp2_frame_pack_frame_hd((pnVar1->buf).pos,&frame->hd);
      sVar2 = nghttp2_frame_pack_settings_payload((pnVar1->buf).last,frame->iv,frame->niv);
      (pnVar1->buf).last = (pnVar1->buf).last + sVar2;
      bufs_local._4_4_ = 0;
    }
    return bufs_local._4_4_;
  }
  __assert_fail("bufs->head == bufs->cur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x1e8,"int nghttp2_frame_pack_settings(nghttp2_bufs *, nghttp2_settings *)");
}

Assistant:

int nghttp2_frame_pack_settings(nghttp2_bufs *bufs, nghttp2_settings *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  if (nghttp2_buf_avail(buf) < frame->hd.length) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  buf->last +=
      nghttp2_frame_pack_settings_payload(buf->last, frame->iv, frame->niv);

  return 0;
}